

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

ScriptWitness * __thiscall
cfd::core::ConfidentialTransaction::SetScriptWitnessStack
          (ScriptWitness *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t tx_in_index,
          uint32_t witness_index,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  pointer pCVar1;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  ScriptWitness local_48;
  
  AbstractTransaction::SetScriptWitnessStack
            (&this->super_AbstractTransaction,tx_in_index,witness_index,data);
  pCVar1 = (this->vin_).
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ByteData::ByteData((ByteData *)&local_60,data);
  AbstractTxIn::SetScriptWitnessStack
            (&local_48,&pCVar1[tx_in_index].super_AbstractTxIn,witness_index,(ByteData *)&local_60);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
  ScriptWitness::ScriptWitness(__return_storage_ptr__,&local_48);
  ScriptWitness::~ScriptWitness(&local_48);
  return __return_storage_ptr__;
}

Assistant:

const ScriptWitness ConfidentialTransaction::SetScriptWitnessStack(
    uint32_t tx_in_index, uint32_t witness_index,
    const std::vector<uint8_t> &data) {
  AbstractTransaction::SetScriptWitnessStack(tx_in_index, witness_index, data);

  const ScriptWitness &witness =
      vin_[tx_in_index].SetScriptWitnessStack(witness_index, ByteData(data));
  return witness;
}